

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int wildcard_match(uchar *prefix,size_t prefix_len,uchar *suffix,size_t suffix_len,uchar *subject,
                  size_t subject_len,uint flags)

{
  bool bVar1;
  int iVar2;
  byte *pattern;
  byte *pbStack_58;
  int allow_idna;
  uchar *p;
  uchar *wildcard_end;
  uchar *wildcard_start;
  size_t subject_len_local;
  uchar *subject_local;
  size_t suffix_len_local;
  uchar *suffix_local;
  size_t prefix_len_local;
  uchar *prefix_local;
  
  bVar1 = false;
  if (subject_len < prefix_len + suffix_len) {
    prefix_local._4_4_ = 0;
  }
  else {
    iVar2 = equal_nocase(prefix,prefix_len,subject,prefix_len,flags);
    if (iVar2 == 0) {
      prefix_local._4_4_ = 0;
    }
    else {
      pbStack_58 = subject + prefix_len;
      pattern = subject + (subject_len - suffix_len);
      iVar2 = equal_nocase(pattern,suffix_len,suffix,suffix_len,flags);
      if (iVar2 == 0) {
        prefix_local._4_4_ = 0;
      }
      else {
        if ((prefix_len == 0) && (*suffix == '.')) {
          if (pbStack_58 == pattern) {
            return 0;
          }
          bVar1 = true;
        }
        if (((bVar1) || (subject_len < 4)) ||
           (iVar2 = OPENSSL_strncasecmp((char *)subject,"xn--",4), iVar2 != 0)) {
          if ((pattern == pbStack_58 + 1) && (*pbStack_58 == 0x2a)) {
            prefix_local._4_4_ = 1;
          }
          else {
            for (; pbStack_58 != pattern; pbStack_58 = pbStack_58 + 1) {
              iVar2 = OPENSSL_isalnum((uint)*pbStack_58);
              if ((iVar2 == 0) && (*pbStack_58 != 0x2d)) {
                return 0;
              }
            }
            prefix_local._4_4_ = 1;
          }
        }
        else {
          prefix_local._4_4_ = 0;
        }
      }
    }
  }
  return prefix_local._4_4_;
}

Assistant:

static int wildcard_match(const unsigned char *prefix, size_t prefix_len,
                          const unsigned char *suffix, size_t suffix_len,
                          const unsigned char *subject, size_t subject_len,
                          unsigned int flags) {
  const unsigned char *wildcard_start;
  const unsigned char *wildcard_end;
  const unsigned char *p;
  int allow_idna = 0;

  if (subject_len < prefix_len + suffix_len) {
    return 0;
  }
  if (!equal_nocase(prefix, prefix_len, subject, prefix_len, flags)) {
    return 0;
  }
  wildcard_start = subject + prefix_len;
  wildcard_end = subject + (subject_len - suffix_len);
  if (!equal_nocase(wildcard_end, suffix_len, suffix, suffix_len, flags)) {
    return 0;
  }
  // If the wildcard makes up the entire first label, it must match at
  // least one character.
  if (prefix_len == 0 && *suffix == '.') {
    if (wildcard_start == wildcard_end) {
      return 0;
    }
    allow_idna = 1;
  }
  // IDNA labels cannot match partial wildcards
  if (!allow_idna && subject_len >= 4 &&
      OPENSSL_strncasecmp((char *)subject, "xn--", 4) == 0) {
    return 0;
  }
  // The wildcard may match a literal '*'
  if (wildcard_end == wildcard_start + 1 && *wildcard_start == '*') {
    return 1;
  }
  // Check that the part matched by the wildcard contains only
  // permitted characters and only matches a single label.
  for (p = wildcard_start; p != wildcard_end; ++p) {
    if (!OPENSSL_isalnum(*p) && *p != '-') {
      return 0;
    }
  }
  return 1;
}